

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O1

ActionMessage * __thiscall
helics::ipc::OwnedQueue::getMessage(ActionMessage *__return_storage_ptr__,OwnedQueue *this)

{
  int iVar1;
  _Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
  this_00;
  pointer buffer;
  size_t rx_size;
  uint priority;
  date_type local_64;
  OwnedQueue *local_60;
  ActionMessage *local_58;
  size_type local_50;
  time_duration_type local_48;
  uint local_3c;
  ptime local_38;
  
  if (this->connected == false) {
    ActionMessage::ActionMessage(__return_storage_ptr__,cmd_error);
  }
  else {
    local_50 = 0;
    local_3c = 0;
    local_60 = this;
    local_58 = __return_storage_ptr__;
    while( true ) {
      do {
        this_00._M_head_impl =
             (local_60->rqueue)._M_t.
             super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
             .
             super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
             ._M_head_impl;
        buffer = (local_60->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = local_60->mxSize;
        local_64.
        super_date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
        .days_ = (date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
                  )0xfffffffe;
        local_48.
        super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
        .ticks_.value_ =
             (time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
              )(impl_type)0x7ffffffffffffffe;
        boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>::
        counted_time_rep((counted_time_rep<boost::posix_time::millisec_posix_time_system_config> *)
                         &local_38,&local_64,&local_48);
        boost::interprocess::
        message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>::
        do_receive(this_00._M_head_impl,blocking,buffer,(long)iVar1,&local_50,&local_3c,&local_38);
        __return_storage_ptr__ = local_58;
      } while (local_50 < 8);
      ActionMessage::ActionMessage
                (local_58,(local_60->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl
                          .super__Vector_impl_data._M_start,local_50);
      if (__return_storage_ptr__->messageAction != cmd_invalid) break;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"invalid command received ipc",0x1c);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      ActionMessage::~ActionMessage(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ActionMessage OwnedQueue::getMessage()
    {
        if (!connected) {
            return (CMD_ERROR);
        }
        size_t rx_size = 0;
        unsigned int priority{0};
        while (true) {
            rqueue->receive(buffer.data(), mxSize, rx_size, priority);
            if (rx_size < 8) {
                continue;
            }
            ActionMessage cmd(reinterpret_cast<std::byte*>(buffer.data()), rx_size);
            if (!isValidCommand(cmd)) {
                std::cerr << "invalid command received ipc" << std::endl;
                continue;
            }
            return cmd;
        }
    }